

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O2

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
::next_impl<0ul,1ul>
          (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           *__return_storage_ptr__,
          vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
          *this)

{
  ptrdiff_t pVar1;
  BrailleCanvas *pBVar2;
  block_t *pbVar3;
  BrailleCanvas *pBVar4;
  block_t *pbVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  undefined4 uVar9;
  uint uVar10;
  vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
  *pvVar11;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **ppFVar12;
  size_t sVar13;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *pFVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  line_t lVar17;
  BrailleCanvas *local_88;
  block_t *pbStack_80;
  Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *local_68;
  long lStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  int iStack_4c;
  BrailleCanvas *local_48;
  block_t *pbStack_40;
  
  pvVar11 = this;
  sVar6 = current_index<0ul,1ul>();
  uVar9 = SUB84(pvVar11,0);
  if (sVar6 == 0) {
    local_68 = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0x40);
    lStack_60 = *(long *)(this + 0x48);
    local_48 = *(BrailleCanvas **)(this + 0x60);
    pbStack_40 = *(block_t **)(this + 0x68);
    ppFVar12 = &local_68;
    local_58 = (undefined4)*(undefined8 *)(this + 0x50);
    uStack_54 = (undefined4)((ulong)*(undefined8 *)(this + 0x50) >> 0x20);
    iStack_50 = (int)*(undefined8 *)(this + 0x58);
    iStack_4c = (int)((ulong)*(undefined8 *)(this + 0x58) >> 0x20);
    std::
    __advance<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,long>
              (ppFVar12,1);
    uVar9 = SUB84(ppFVar12,0);
    lVar17.canvas_._4_4_ = uStack_54;
    lVar17.canvas_._0_4_ = local_58;
    lVar17.it_._M_current._0_4_ = iStack_50;
    lVar17.it_._M_current._4_4_ = iStack_4c;
    local_88 = local_48;
    pbStack_80 = pbStack_40;
    lVar7 = lStack_60;
    pFVar14 = local_68;
  }
  else {
    pFVar14 = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0x40);
    lVar7 = *(long *)(this + 0x48);
    lVar17 = *(line_t *)(this + 0x50);
    local_88 = *(BrailleCanvas **)(this + 0x60);
    pbStack_80 = *(block_t **)(this + 0x68);
    if (sVar6 == 1) {
      local_68 = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0x10);
      lStack_60 = *(long *)(this + 0x18);
      local_48 = *(BrailleCanvas **)(this + 0x30);
      pbStack_40 = *(block_t **)(this + 0x38);
      ppFVar12 = &local_68;
      local_58 = (undefined4)*(undefined8 *)(this + 0x20);
      uStack_54 = (undefined4)((ulong)*(undefined8 *)(this + 0x20) >> 0x20);
      iStack_50 = (int)*(undefined8 *)(this + 0x28);
      iStack_4c = (int)((ulong)*(undefined8 *)(this + 0x28) >> 0x20);
      std::
      __advance<plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>*>>,long>
                (ppFVar12,1);
      uVar9 = SUB84(ppFVar12,0);
      goto LAB_0010f9aa;
    }
  }
  local_68 = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0x10);
  lStack_60 = *(long *)(this + 0x18);
  local_58 = *(undefined4 *)(this + 0x20);
  uStack_54 = *(undefined4 *)(this + 0x24);
  iStack_50 = *(int *)(this + 0x28);
  iStack_4c = *(int *)(this + 0x2c);
  local_48 = *(BrailleCanvas **)(this + 0x30);
  pbStack_40 = *(block_t **)(this + 0x38);
LAB_0010f9aa:
  auVar16._0_4_ = -(uint)((int)*(undefined8 *)(this + 0x88) == iStack_50);
  auVar16._4_4_ = -(uint)((int)((ulong)*(undefined8 *)(this + 0x88) >> 0x20) == iStack_4c);
  auVar16._8_4_ = -(uint)((int)*(undefined8 *)(this + 0xb8) == (int)lVar17.it_._M_current);
  auVar16._12_4_ =
       -(uint)((int)((ulong)*(undefined8 *)(this + 0xb8) >> 0x20) == lVar17.it_._M_current._4_4_);
  auVar15._4_4_ = auVar16._0_4_;
  auVar15._0_4_ = auVar16._4_4_;
  auVar15._8_4_ = auVar16._12_4_;
  auVar15._12_4_ = auVar16._8_4_;
  uVar10 = movmskpd(uVar9,auVar15 & auVar16);
  sVar8 = 0;
  sVar13 = 2 - (ulong)((byte)(lStack_60 != *(long *)(this + 0x78) | (byte)(uVar10 ^ 3)) & 1);
  if (lVar7 != *(long *)(this + 0xa8)) {
    sVar13 = sVar8;
  }
  if (((uVar10 ^ 3) & 2) != 0) {
    sVar13 = sVar8;
  }
  if (sVar13 != sVar6) {
    sVar8 = (*(VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
               **)this)->margin_;
  }
  __return_storage_ptr__->vbox_ =
       *(VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
         **)this;
  __return_storage_ptr__->margin_ = sVar8;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ = local_68;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = lStack_60;
  *(undefined4 *)
   &(__return_storage_ptr__->lines_).
    super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
    .
    super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
    ._M_head_impl.line_.line_.line_.canvas_ = local_58;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->lines_).
           super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
           .
           super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
           .
           super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
           ._M_head_impl.line_.line_ + 4) = uStack_54;
  *(int *)&((const_iterator *)
           ((long)&(__return_storage_ptr__->lines_).
                   super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                   .
                   super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                   .
                   super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                   ._M_head_impl.line_.line_ + 8))->_M_current = iStack_50;
  *(int *)((long)&(__return_storage_ptr__->lines_).
                  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
                  .
                  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                  ._M_head_impl.line_.line_ + 0xc) = iStack_4c;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ = local_48;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->lines_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.end_ + 8))->_M_current = pbStack_40;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ = pFVar14;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = lVar7;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_ = lVar17;
  (__return_storage_ptr__->lines_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ = local_88;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->lines_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.end_.line_ + 8))->_M_current = pbStack_80;
  pVar1 = *(ptrdiff_t *)(this + 0x78);
  pBVar2 = *(BrailleCanvas **)(this + 0x80);
  pbVar3 = *(block_t **)(this + 0x88);
  pBVar4 = *(BrailleCanvas **)(this + 0x90);
  pbVar5 = *(block_t **)(this + 0x98);
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0x70);
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = pVar1;
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ = pBVar2;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->ends_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.line_ + 8))->_M_current = pbVar3;
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ = pBVar4;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->ends_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.end_ + 8))->_M_current = pbVar5;
  pVar1 = *(ptrdiff_t *)(this + 0xa8);
  pBVar2 = *(BrailleCanvas **)(this + 0xb0);
  pbVar3 = *(block_t **)(this + 0xb8);
  pBVar4 = *(BrailleCanvas **)(this + 0xc0);
  pbVar5 = *(block_t **)(this + 200);
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ = *(Frame<plot::RealCanvas<plot::BrailleCanvas>_*> **)(this + 0xa0);
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = pVar1;
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ = pBVar2;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->ends_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.line_.line_ + 8))->_M_current = pbVar3;
  (__return_storage_ptr__->ends_).
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ = pBVar4;
  ((const_iterator *)
  ((long)&(__return_storage_ptr__->ends_).
          super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
          .
          super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
          ._M_head_impl.line_.end_.line_ + 8))->_M_current = pbVar5;
  return __return_storage_ptr__;
}

Assistant:

vbox_line next_impl(std::index_sequence<N...> indices) const {
            auto current = current_index(indices);
            block_iterators nxt(((N != current) ? std::get<N>(lines_) : std::next(std::get<N>(lines_)))...);
            return {
                vbox_,
                (find_true((std::get<N>(nxt) != std::get<N>(ends_))...) != current) ? vbox_->margin_ : 0,
                nxt,
                ends_
            };
        }